

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CLI11.hpp
# Opt level: O0

Option * __thiscall CLI::Option::type_name(Option *this,string *typeval)

{
  string *in_RSI;
  Option *in_RDI;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffff88;
  string *this_00;
  function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  *in_stack_ffffffffffffffa0;
  string local_50 [80];
  
  this_00 = local_50;
  ::std::__cxx11::string::string(this_00,in_RSI);
  ::std::function<std::__cxx11::string()>::
  function<CLI::Option::type_name(std::__cxx11::string)::_lambda()_1_,void>
            (in_stack_ffffffffffffffa0,(anon_class_32_1_50816887 *)this_00);
  type_name_fn(in_RDI,in_stack_ffffffffffffff88);
  std::function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
  ::~function((function<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_()>
               *)0x18cb63);
  type_name(std::__cxx11::string)::{lambda()#1}::~basic_string((anon_class_32_1_50816887 *)0x18cb6d)
  ;
  return in_RDI;
}

Assistant:

Option *type_name(std::string typeval) {
        type_name_fn([typeval]() { return typeval; });
        return this;
    }